

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O1

void __thiscall libwebm::PesOptionalHeader::SetPtsBits(PesOptionalHeader *this,int64_t pts_90khz)

{
  (this->pts).bits =
       (ulong)((uint)((ulong)pts_90khz >> 0x1d) & 0xe) |
       (ulong)((uint)((ulong)pts_90khz >> 0x16) & 0xff |
              ((uint)pts_90khz & 0x7f80) << 9 | (uint)pts_90khz << 0x19 |
              (uint)((ulong)pts_90khz >> 6) & 0xfffe00) << 8 | 0x100010021;
  return;
}

Assistant:

void PesOptionalHeader::SetPtsBits(std::int64_t pts_90khz) {
  // PTS is broken up and stored in 40 bits as shown:
  //
  //  PES PTS Only flag
  // /                  Marker              Marker              Marker
  // |                 /                   /                   /
  // |                 |                   |                   |
  // 7654  321         0  765432107654321  0  765432107654321  0
  // 0010  PTS 32-30   1  PTS 29-15        1  PTS 14-0         1
  const std::uint32_t pts1 = (pts_90khz >> 30) & 0x7;
  const std::uint32_t pts2 = (pts_90khz >> 15) & 0x7FFF;
  const std::uint32_t pts3 = pts_90khz & 0x7FFF;

  pts.bits = 0;

  // bottom 7 bits of second PTS chunk.
  pts.bits |= (pts3 << 1) & 0xff;
  // Marker.
  pts.bits |= 1;

  // Last 15 bits of pts and 1 bit marker.
  // Top 8 bits of second PTS chunk.
  pts.bits <<= 8;
  pts.bits |= (pts3 >> 7) & 0xff;

  // bottom 7 bits of second PTS chunk.
  pts.bits <<= 8;
  pts.bits |= (pts2 << 1);
  // Marker.
  pts.bits |= 1;

  // Next 15 bits of pts and 1 bit marker.
  // Top 8 bits of second PTS chunk.
  pts.bits <<= 8;
  pts.bits |= (pts2 >> 7) & 0xff;

  // PTS only flag.
  pts.bits <<= 8;
  pts.bits |= 1 << 5;
  // Top 3 bits of PTS and 1 bit marker.
  pts.bits |= pts1 << 1;
  // Marker.
  pts.bits |= 1;
}